

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.hpp
# Opt level: O2

void cinatra::finish<void>(sha1_context *ctx,void *digest)

{
  size_t sVar1;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint32_t block [16];
  uint32_t local_68 [14];
  ulong local_30;
  
  sVar1 = ctx->buflen;
  sVar2 = ctx->blocks;
  ctx->buflen = sVar1 + 1;
  ctx->buf[sVar1] = 0x80;
  uVar5 = ctx->buflen;
  uVar3 = uVar5;
  while (uVar3 < 0x40) {
    ctx->buflen = uVar3 + 1;
    ctx->buf[uVar3] = '\0';
    uVar3 = ctx->buflen;
  }
  sha1::make_block(ctx->buf,local_68);
  if (0x38 < uVar5) {
    sha1::transform<void>(ctx->digest,local_68);
    for (lVar4 = 0; lVar4 != 0xe; lVar4 = lVar4 + 1) {
      local_68[lVar4] = 0;
    }
  }
  uVar5 = sVar1 * 8 + sVar2 * 0x200;
  local_30 = uVar5 >> 0x20 | uVar5 << 0x20;
  sha1::transform<void>(ctx->digest,local_68);
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    *(char *)((long)digest + lVar4 * 4 + 3) = (char)ctx->digest[lVar4];
    *(undefined1 *)((long)digest + lVar4 * 4 + 2) =
         *(undefined1 *)((long)ctx->digest + lVar4 * 4 + 1);
    *(undefined1 *)((long)digest + lVar4 * 4 + 1) =
         *(undefined1 *)((long)ctx->digest + lVar4 * 4 + 2);
    *(undefined1 *)((long)digest + lVar4 * 4) = *(undefined1 *)((long)ctx->digest + lVar4 * 4 + 3);
  }
  return;
}

Assistant:

inline void finish(sha1_context &ctx, void *digest) noexcept {
  using sha1::BLOCK_BYTES;
  using sha1::BLOCK_INTS;

  std::uint64_t total_bits = (ctx.blocks * 64 + ctx.buflen) * 8;
  // pad
  ctx.buf[ctx.buflen++] = 0x80;
  auto const buflen = ctx.buflen;
  while (ctx.buflen < 64) ctx.buf[ctx.buflen++] = 0x00;
  std::uint32_t block[BLOCK_INTS];
  sha1::make_block(ctx.buf, block);
  if (buflen > BLOCK_BYTES - 8) {
    sha1::transform(ctx.digest, block);
    for (size_t i = 0; i < BLOCK_INTS - 2; i++) block[i] = 0;
  }

  /* Append total_bits, split this uint64_t into two uint32_t */
  block[BLOCK_INTS - 1] = total_bits & 0xffffffff;
  block[BLOCK_INTS - 2] = (total_bits >> 32);
  sha1::transform(ctx.digest, block);
  for (std::size_t i = 0; i < sha1::DIGEST_BYTES / 4; i++) {
    std::uint8_t *d = reinterpret_cast<std::uint8_t *>(digest) + 4 * i;
    d[3] = ctx.digest[i] & 0xff;
    d[2] = (ctx.digest[i] >> 8) & 0xff;
    d[1] = (ctx.digest[i] >> 16) & 0xff;
    d[0] = (ctx.digest[i] >> 24) & 0xff;
  }
}